

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O3

void opj_mct_encode(OPJ_INT32 *c0,OPJ_INT32 *c1,OPJ_INT32 *c2,OPJ_SIZE_T n)

{
  int *piVar1;
  OPJ_INT32 *pOVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  
  if (((ulong)c0 & 0xf) != 0) {
    __assert_fail("((size_t)c0 & 0xf) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/mct.c"
                  ,0x55,
                  "void opj_mct_encode(OPJ_INT32 *restrict, OPJ_INT32 *restrict, OPJ_INT32 *restrict, OPJ_SIZE_T)"
                 );
  }
  if (((ulong)c1 & 0xf) == 0) {
    if (((ulong)c2 & 0xf) == 0) {
      uVar15 = 0;
      if ((n & 0xfffffffc) != 0) {
        do {
          piVar1 = c0 + uVar15;
          iVar3 = *piVar1;
          iVar4 = piVar1[1];
          iVar5 = piVar1[2];
          iVar6 = piVar1[3];
          piVar1 = c1 + uVar15;
          iVar7 = *piVar1;
          iVar8 = piVar1[1];
          iVar9 = piVar1[2];
          iVar10 = piVar1[3];
          piVar1 = c2 + uVar15;
          iVar11 = *piVar1;
          iVar12 = piVar1[1];
          iVar13 = piVar1[2];
          iVar14 = piVar1[3];
          pOVar2 = c0 + uVar15;
          *pOVar2 = iVar11 + iVar3 + iVar7 * 2 >> 2;
          pOVar2[1] = iVar12 + iVar4 + iVar8 * 2 >> 2;
          pOVar2[2] = iVar13 + iVar5 + iVar9 * 2 >> 2;
          pOVar2[3] = iVar14 + iVar6 + iVar10 * 2 >> 2;
          pOVar2 = c1 + uVar15;
          *pOVar2 = iVar11 - iVar7;
          pOVar2[1] = iVar12 - iVar8;
          pOVar2[2] = iVar13 - iVar9;
          pOVar2[3] = iVar14 - iVar10;
          pOVar2 = c2 + uVar15;
          *pOVar2 = iVar3 - iVar7;
          pOVar2[1] = iVar4 - iVar8;
          pOVar2[2] = iVar5 - iVar9;
          pOVar2[3] = iVar6 - iVar10;
          uVar15 = uVar15 + 4;
        } while (uVar15 < (n & 0xfffffffc));
      }
      if (uVar15 < n) {
        do {
          iVar3 = c0[uVar15];
          iVar4 = c1[uVar15];
          iVar5 = c2[uVar15];
          c0[uVar15] = iVar3 + iVar4 * 2 + iVar5 >> 2;
          c1[uVar15] = iVar5 - iVar4;
          c2[uVar15] = iVar3 - iVar4;
          uVar15 = uVar15 + 1;
        } while (n != uVar15);
      }
      return;
    }
    __assert_fail("((size_t)c2 & 0xf) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/mct.c"
                  ,0x57,
                  "void opj_mct_encode(OPJ_INT32 *restrict, OPJ_INT32 *restrict, OPJ_INT32 *restrict, OPJ_SIZE_T)"
                 );
  }
  __assert_fail("((size_t)c1 & 0xf) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/mct.c"
                ,0x56,
                "void opj_mct_encode(OPJ_INT32 *restrict, OPJ_INT32 *restrict, OPJ_INT32 *restrict, OPJ_SIZE_T)"
               );
}

Assistant:

void opj_mct_encode(
    OPJ_INT32* OPJ_RESTRICT c0,
    OPJ_INT32* OPJ_RESTRICT c1,
    OPJ_INT32* OPJ_RESTRICT c2,
    OPJ_SIZE_T n)
{
    OPJ_SIZE_T i;
    const OPJ_SIZE_T len = n;
    /* buffer are aligned on 16 bytes */
    assert(((size_t)c0 & 0xf) == 0);
    assert(((size_t)c1 & 0xf) == 0);
    assert(((size_t)c2 & 0xf) == 0);

    for (i = 0; i < (len & ~3U); i += 4) {
        __m128i y, u, v;
        __m128i r = _mm_load_si128((const __m128i *) & (c0[i]));
        __m128i g = _mm_load_si128((const __m128i *) & (c1[i]));
        __m128i b = _mm_load_si128((const __m128i *) & (c2[i]));
        y = _mm_add_epi32(g, g);
        y = _mm_add_epi32(y, b);
        y = _mm_add_epi32(y, r);
        y = _mm_srai_epi32(y, 2);
        u = _mm_sub_epi32(b, g);
        v = _mm_sub_epi32(r, g);
        _mm_store_si128((__m128i *) & (c0[i]), y);
        _mm_store_si128((__m128i *) & (c1[i]), u);
        _mm_store_si128((__m128i *) & (c2[i]), v);
    }

    for (; i < len; ++i) {
        OPJ_INT32 r = c0[i];
        OPJ_INT32 g = c1[i];
        OPJ_INT32 b = c2[i];
        OPJ_INT32 y = (r + (g * 2) + b) >> 2;
        OPJ_INT32 u = b - g;
        OPJ_INT32 v = r - g;
        c0[i] = y;
        c1[i] = u;
        c2[i] = v;
    }
}